

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpFactory.cpp
# Opt level: O1

Op * __thiscall xercesc_4_0::OpFactory::createDotOp(OpFactory *this)

{
  BaseRefVectorOf<xercesc_4_0::Op> *this_00;
  XMLSize_t XVar1;
  Op *this_01;
  
  this_01 = (Op *)XMemory::operator_new(0x20,this->fMemoryManager);
  Op::Op(this_01,O_DOT,this->fMemoryManager);
  this_00 = &this->fOpVector->super_BaseRefVectorOf<xercesc_4_0::Op>;
  BaseRefVectorOf<xercesc_4_0::Op>::ensureExtraCapacity(this_00,1);
  XVar1 = this_00->fCurCount;
  this_00->fElemList[XVar1] = this_01;
  this_00->fCurCount = XVar1 + 1;
  return this_01;
}

Assistant:

Op* OpFactory::createDotOp() {

    Op* tmpOp = new (fMemoryManager) Op(Op::O_DOT, fMemoryManager);
    fOpVector->addElement(tmpOp);
    return tmpOp;
}